

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_string_helper.c
# Opt level: O0

void helper_gvec_vfene_cc16(void *v1,void *v2,void *v3,CPUS390XState_conflict *env,uint32_t desc)

{
  uint32_t uVar1;
  _Bool zs;
  uint32_t desc_local;
  CPUS390XState_conflict *env_local;
  void *v3_local;
  void *v2_local;
  void *v1_local;
  
  uVar1 = simd_data(desc);
  uVar1 = extract32(uVar1,1,1);
  uVar1 = vfene(v1,v2,v3,uVar1 != 0,'\x01');
  env->cc_op = uVar1;
  return;
}

Assistant:

static int vistr(void *v1, const void *v2, uint8_t es)
{
    const uint64_t mask = get_element_lsbs_mask(es);
    uint64_t a0 = s390_vec_read_element64(v2, 0);
    uint64_t a1 = s390_vec_read_element64(v2, 1);
    uint64_t z;
    int cc = 3;

    z = zero_search(a0, mask);
    if (z) {
        a0 &= ~(-1ull >> clz64(z));
        a1 = 0;
        cc = 0;
    } else {
        z = zero_search(a1, mask);
        if (z) {
            a1 &= ~(-1ull >> clz64(z));
            cc = 0;
        }
    }

    s390_vec_write_element64(v1, 0, a0);
    s390_vec_write_element64(v1, 1, a1);
    return cc;
}